

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python-puppet.hpp
# Opt level: O0

PyObject * pybind11_init_impl_pyhenson(void)

{
  PyObject *pPVar1;
  
  pPVar1 = pybind11_init_wrapper_pyhenson();
  return pPVar1;
}

Assistant:

PYBIND11_EMBEDDED_MODULE(pyhenson, m)
{
    using namespace henson;

    auto self = []()
    {
        auto self__ = py::module::import("pyhenson").attr("self");
        void* self_ = reinterpret_cast<void*>(self__.cast<intptr_t>());
        PythonPuppet* self = (PythonPuppet*) self_;
        return self;
    };

    auto nm = [self]()
    {
        NameMap*      nm   = self()->namemap_;
        return nm;
    };

    m.def("yield_",     [self]() { self()->yield(); });
    m.def("stop",       [self]() { return self()->stop_ != 0; });

    m.def("get",        [nm](std::string name) -> py::object
                        {
                            struct extract_array
                            {
                                py::object   operator()(float* a) const     { return py::array_t<float>({ count }, { stride }, a); }
                                py::object   operator()(double* a) const    { return py::array_t<double>({ count }, { stride }, a); }
                                py::object   operator()(int* a) const       { return py::array_t<int>({ count }, { stride }, a); }
                                py::object   operator()(long* a) const      { return py::array_t<long>({ count }, { stride }, a); }
                                py::object   operator()(void*) const        { throw py::cast_error("Cannot convert void* array to NumPy"); }

                                size_t count;
                                size_t stride;
                            };

                            struct extract
                            {
                                py::object operator()(int x) const      { return py::int_(x); }
                                py::object operator()(size_t x) const   { return py::int_(x); }
                                py::object operator()(float x) const    { return py::float_(x); }
                                py::object operator()(double x) const   { return py::float_(x); }
                                py::object operator()(void* x) const    { throw  py::cast_error("Cannot return void* to Python"); }
                                py::object operator()(Array a) const    { return visit(extract_array { a.count, a.stride }, a.address); }
                                py::object operator()(std::string x) const   { return py::str(x); }
                            };
                            return visit(extract{}, nm()->get(name));
                        });
    m.def("add",        [nm](std::string name, int    x)    { Value v = x; nm()->add(name, v); });
    m.def("add",        [nm](std::string name, size_t x)    { Value v = x; nm()->add(name, v); });
    m.def("add",        [nm](std::string name, float  x)    { Value v = x; nm()->add(name, v); });
    m.def("add",        [nm](std::string name, double x)    { Value v = x; nm()->add(name, v); });
    m.def("add",        [nm](std::string name, py::array& x)
    {
        Value v;
        if (x.dtype().is(py::dtype::of<float>()))
            v = henson::Array(static_cast<float*>(x.mutable_data()), sizeof(float), x.size(), x.strides(0));
        else if (x.dtype().is(py::dtype::of<double>()))
            v = henson::Array(static_cast<double*>(x.mutable_data()), sizeof(double), x.size(), x.strides(0));
        else if (x.dtype().is(py::dtype::of<int>()))
            v = henson::Array(static_cast<int*>(x.mutable_data()), sizeof(int), x.size(), x.strides(0));
        else if (x.dtype().is(py::dtype::of<long>()))
            v = henson::Array(static_cast<long*>(x.mutable_data()), sizeof(long), x.size(), x.strides(0));
        else
            throw std::runtime_error("Unknown array dtype");

        nm()->add(name, v);
    });
    m.def("add",        [nm](std::string name, std::string x)    { Value v = x; nm()->add(name, v); });

    m.def("create_queue",   [nm](std::string name)          { nm()->create_queue(name); });
    m.def("queue_empty",    [nm](std::string name)          { return nm()->queue_empty(name); });

    m.def("exists",     [nm](std::string name)      { return nm()->exists(name); });
    m.def("clear",      [nm]()                      { nm()->clear(); });
}